

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

bool __thiscall
ddd::DaTrie<false,_false,_true>::search_prefix(DaTrie<false,_false,_true> *this,Query *query)

{
  pointer pBVar1;
  Bc BVar2;
  uint uVar3;
  
  while( true ) {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    BVar2 = pBVar1[query->node_pos_];
    uVar3 = BVar2._0_4_;
    if ((int)uVar3 < 0) break;
    if ((uVar3 == 0x7fffffff) ||
       (uVar3 = (byte)query->key_[query->pos_] ^ uVar3,
       (*(uint *)&pBVar1[uVar3].field_0x4 & 0x7fffffff) != query->node_pos_)) goto LAB_0012430e;
    query->node_pos_ = uVar3;
    Query::next(query);
  }
  query->value_ = uVar3 & 0x7fffffff;
LAB_0012430e:
  return (bool)(BVar2._3_1_ >> 7);
}

Assistant:

bool search_prefix(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto base = bc_[query.node_pos()].base();
      if (base == INVALID_VALUE) {
        return false;
      }
      auto child_pos = base ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    query.set_value(bc_[query.node_pos()].value());
    return true;
  }